

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_alternative_serial.cpp
# Opt level: O0

void test_dump(void)

{
  double __x;
  allocator<char> local_51;
  string local_50;
  undefined1 local_30 [36];
  int local_c;
  Printer<__filename,___prefix> __tracer;
  int answer;
  
  SpyingSerial::clear(&Serial2);
  local_c = 0x2a;
  ArduinoTrace::Printer<test_dump()::__filename,test_dump()::__prefix>::Printer<SpyingSerial,int>
            ((Printer<test_dump()::__filename,test_dump()::__prefix> *)(local_30 + 0x23),&Serial2,
             &local_c);
  SpyingSerial::log_abi_cxx11_((SpyingSerial *)local_30,__x);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"test_alternative_serial.cpp:\\d+: answer = 42\r\nflush\\(\\)\r\n",
             &local_51);
  ASSERT_RE((string *)local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void test_dump() {
  Serial2.clear();
  int answer = 42;
  DUMP(answer);
  ASSERT_RE(Serial2.log(),
            "test_alternative_serial.cpp:\\d+: answer = 42\r\n"
            "flush\\(\\)\r\n");
}